

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O3

void __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe<long>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *build_sel_vec,
          SelectionVector *probe_sel_vec,idx_t count,idx_t *probe_sel_count)

{
  sel_t *psVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  int64_t iVar6;
  int64_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  ulong uVar12;
  idx_t iVar13;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  iVar6 = Value::GetValueUnsafe<long>(&(this->perfect_join_statistics).build_min);
  iVar7 = Value::GetValueUnsafe<long>(&(this->perfect_join_statistics).build_max);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(source,count,&local_78);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      iVar8 = *probe_sel_count;
      psVar1 = (local_78.sel)->sel_vector;
      _Var2._M_head_impl =
           (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      psVar3 = build_sel_vec->sel_vector;
      psVar4 = probe_sel_vec->sel_vector;
      iVar10 = 0;
      lVar11 = 0;
      do {
        iVar13 = iVar10;
        if (psVar1 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar1[iVar10];
        }
        lVar5 = *(long *)(local_78.data + iVar13 * 8);
        if ((lVar5 <= iVar7 && iVar6 <= lVar5) && (_Var2._M_head_impl[lVar5 - iVar6] == true)) {
          psVar3[lVar11] = (sel_t)(lVar5 - iVar6);
          psVar4[lVar11] = (sel_t)iVar10;
          lVar11 = lVar11 + 1;
          iVar8 = iVar8 + 1;
          *probe_sel_count = iVar8;
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else if (count != 0) {
    iVar8 = *probe_sel_count;
    psVar1 = (local_78.sel)->sel_vector;
    _Var2._M_head_impl =
         (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    psVar3 = build_sel_vec->sel_vector;
    psVar4 = probe_sel_vec->sel_vector;
    lVar11 = 0;
    uVar12 = 0;
    do {
      uVar9 = uVar12;
      if (psVar1 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar1[uVar12];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9 >> 6] >>
           (uVar9 & 0x3f) & 1) != 0) {
        lVar5 = *(long *)(local_78.data + uVar9 * 8);
        if ((lVar5 <= iVar7 && iVar6 <= lVar5) && (_Var2._M_head_impl[lVar5 - iVar6] == true)) {
          psVar3[lVar11] = (sel_t)(lVar5 - iVar6);
          psVar4[lVar11] = (sel_t)uVar12;
          lVar11 = lVar11 + 1;
          iVar8 = iVar8 + 1;
          *probe_sel_count = iVar8;
        }
      }
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe(Vector &source, SelectionVector &build_sel_vec,
                                                                SelectionVector &probe_sel_vec, idx_t count,
                                                                idx_t &probe_sel_count) {
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();

	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	auto validity_mask = &vector_data.validity;
	// build selection vector for non-dense build
	if (validity_mask->AllValid()) {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	} else {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			if (!validity_mask->RowIsValid(data_idx)) {
				continue;
			}
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	}
}